

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-loadavg.c
# Opt level: O0

int run_test_get_loadavg(void)

{
  double local_28;
  double avg [3];
  
  local_28 = -1.0;
  avg[0] = -1.0;
  avg[1] = -1.0;
  uv_loadavg(&local_28);
  if (local_28 < 0.0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-loadavg.c"
            ,0x1e,"avg[0] >= 0");
    abort();
  }
  if (avg[0] < 0.0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-loadavg.c"
            ,0x1f,"avg[1] >= 0");
    abort();
  }
  if (avg[1] < 0.0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-loadavg.c"
            ,0x20,"avg[2] >= 0");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(get_loadavg) {

  double avg[3] = {-1, -1, -1};
  uv_loadavg(avg);

  ASSERT(avg[0] >= 0);
  ASSERT(avg[1] >= 0);
  ASSERT(avg[2] >= 0);

  return 0;
}